

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UVector * __thiscall
icu_63::ICUService::getDisplayNames
          (ICUService *this,UVector *result,Locale *locale,UnicodeString *matchID,UErrorCode *status
          )

{
  UHashtable *pUVar1;
  UnicodeString *pUVar2;
  bool bVar3;
  UBool UVar4;
  char cVar5;
  int iVar6;
  DNCache *pDVar7;
  UnicodeString *this_00;
  undefined4 extraout_var;
  UHashElement *pUVar9;
  StringPair *obj;
  Locale *p;
  UErrorCode *size;
  int32_t pos_1;
  int32_t pos;
  int32_t local_8c;
  UnicodeString *local_88;
  UObject local_80;
  Hashtable *local_78;
  UnicodeString local_70;
  long *plVar8;
  
  UVector::removeAllElements(result);
  UVector::setDeleter(result,userv_deleteStringPair);
  if (U_ZERO_ERROR < *status) goto LAB_002a551d;
  umtx_lock_63((UMutex *)lock);
  if (this->dnCache == (DNCache *)0x0) {
LAB_002a53a6:
    size = status;
    local_78 = getVisibleIDMap(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pDVar7 = (DNCache *)UMemory::operator_new((UMemory *)0x140,(size_t)size);
      if (pDVar7 != (DNCache *)0x0) {
        local_88 = matchID;
        DNCache::DNCache(pDVar7,locale);
        this->dnCache = pDVar7;
        local_8c = -1;
        local_80._vptr_UObject = (_func_int **)&PTR__UnicodeString_003be258;
        while (pUVar9 = uhash_nextElement_63(local_78->hash,&local_8c),
              pUVar9 != (UHashElement *)0x0) {
          pUVar2 = (UnicodeString *)(pUVar9->key).pointer;
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_80._vptr_UObject;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          this_00 = pUVar2;
          (**(code **)(*(pUVar9->value).pointer + 0x28))();
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002a54c6:
            pDVar7 = this->dnCache;
            if (pDVar7 != (DNCache *)0x0) {
              Locale::~Locale(&pDVar7->locale);
              pUVar1 = (pDVar7->cache).hash;
              if (pUVar1 != (UHashtable *)0x0) {
                uhash_close_63(pUVar1);
              }
            }
            UMemory::operator_delete((UMemory *)pDVar7,this_00);
            this->dnCache = (DNCache *)0x0;
            UnicodeString::~UnicodeString(&local_70);
            bVar3 = false;
            matchID = local_88;
            goto LAB_002a5509;
          }
          pUVar1 = (this->dnCache->cache).hash;
          this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
          if (this_00 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString(this_00,&local_70);
          }
          uhash_put_63(pUVar1,this_00,pUVar2,status);
          if (U_ZERO_ERROR < *status) goto LAB_002a54c6;
          UnicodeString::~UnicodeString(&local_70);
        }
        bVar3 = true;
        matchID = local_88;
        goto LAB_002a5509;
      }
      this->dnCache = (DNCache *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    bVar3 = false;
  }
  else {
    p = locale;
    UVar4 = Locale::operator==(&this->dnCache->locale,locale);
    pDVar7 = this->dnCache;
    if (UVar4 == '\0') {
      if (pDVar7 != (DNCache *)0x0) {
        Locale::~Locale(&pDVar7->locale);
        pUVar1 = (pDVar7->cache).hash;
        if (pUVar1 != (UHashtable *)0x0) {
          uhash_close_63(pUVar1);
        }
      }
      UMemory::operator_delete((UMemory *)pDVar7,p);
      this->dnCache = (DNCache *)0x0;
      goto LAB_002a53a6;
    }
    bVar3 = true;
    if (pDVar7 == (DNCache *)0x0) goto LAB_002a53a6;
  }
LAB_002a5509:
  umtx_unlock_63((UMutex *)lock);
  if (!bVar3) {
    return result;
  }
LAB_002a551d:
  iVar6 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  local_70.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0xffffffff;
  pUVar9 = uhash_nextElement_63((this->dnCache->cache).hash,(int32_t *)&local_70);
  if (pUVar9 != (UHashElement *)0x0) {
    do {
      pUVar2 = (UnicodeString *)(pUVar9->value).pointer;
      if ((plVar8 == (long *)0x0) ||
         (cVar5 = (**(code **)(*plVar8 + 0x40))(plVar8,pUVar2), cVar5 != '\0')) {
        obj = StringPair::create(pUVar2,(UnicodeString *)(pUVar9->key).pointer,status);
        UVector::addElement(result,obj,status);
        if (U_ZERO_ERROR < *status) {
          UVector::removeAllElements(result);
          break;
        }
      }
      pUVar9 = uhash_nextElement_63((this->dnCache->cache).hash,(int32_t *)&local_70);
    } while (pUVar9 != (UHashElement *)0x0);
  }
  if (plVar8 != (long *)0x0) {
    (**(code **)(*plVar8 + 8))(plVar8);
  }
  return result;
}

Assistant:

UVector& 
ICUService::getDisplayNames(UVector& result, 
                            const Locale& locale, 
                            const UnicodeString* matchID, 
                            UErrorCode& status) const 
{
    result.removeAllElements();
    result.setDeleter(userv_deleteStringPair);
    if (U_SUCCESS(status)) {
        ICUService* ncthis = (ICUService*)this; // cast away semantic const
        Mutex mutex(&lock);

        if (dnCache != NULL && dnCache->locale != locale) {
            delete dnCache;
            ncthis->dnCache = NULL;
        }

        if (dnCache == NULL) {
            const Hashtable* m = getVisibleIDMap(status);
            if (U_FAILURE(status)) {
                return result;
            }
            ncthis->dnCache = new DNCache(locale); 
            if (dnCache == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return result;
            }

            int32_t pos = UHASH_FIRST;
            const UHashElement* entry = NULL;
            while ((entry = m->nextElement(pos)) != NULL) {
                const UnicodeString* id = (const UnicodeString*)entry->key.pointer;
                ICUServiceFactory* f = (ICUServiceFactory*)entry->value.pointer;
                UnicodeString dname;
                f->getDisplayName(*id, locale, dname);
                if (dname.isBogus()) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                } else {
                    dnCache->cache.put(dname, (void*)id, status); // share pointer with visibleIDMap
                    if (U_SUCCESS(status)) {
                        continue;
                    }
                }
                delete dnCache;
                ncthis->dnCache = NULL;
                return result;
            }
        }
    }

    ICUServiceKey* matchKey = createKey(matchID, status);
    /* To ensure that all elements in the hashtable are iterated, set pos to -1.
     * nextElement(pos) will skip the position at pos and begin the iteration
     * at the next position, which in this case will be 0.
     */
    int32_t pos = UHASH_FIRST; 
    const UHashElement *entry = NULL;
    while ((entry = dnCache->cache.nextElement(pos)) != NULL) {
        const UnicodeString* id = (const UnicodeString*)entry->value.pointer;
        if (matchKey != NULL && !matchKey->isFallbackOf(*id)) {
            continue;
        }
        const UnicodeString* dn = (const UnicodeString*)entry->key.pointer;
        StringPair* sp = StringPair::create(*id, *dn, status);
        result.addElement(sp, status);
        if (U_FAILURE(status)) {
            result.removeAllElements();
            break;
        }
    }
    delete matchKey;

    return result;
}